

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O1

void google::protobuf::internal::PrimitiveTypeHelper<9>::Serialize
               (void *ptr,CodedOutputStream *output)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint8 *puVar5;
  byte *pbVar6;
  byte *pbVar7;
  
  uVar1 = *(ulong *)((long)ptr + 8);
  if ((output->impl_).end_ <= output->cur_) {
    puVar5 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,output->cur_);
    output->cur_ = puVar5;
  }
  pbVar6 = output->cur_;
  if ((uint)uVar1 < 0x80) {
    *pbVar6 = (byte)uVar1;
    pbVar6 = pbVar6 + 1;
  }
  else {
    *pbVar6 = (byte)uVar1 | 0x80;
    uVar4 = uVar1 >> 7 & 0x1ffffff;
    if ((uint)uVar1 < 0x4000) {
      pbVar6[1] = (byte)uVar4;
      pbVar6 = pbVar6 + 2;
    }
    else {
      pbVar6 = pbVar6 + 2;
      do {
        pbVar7 = pbVar6;
        uVar2 = (uint)uVar4;
        pbVar7[-1] = (byte)uVar4 | 0x80;
        uVar3 = uVar2 >> 7;
        uVar4 = (ulong)uVar3;
        pbVar6 = pbVar7 + 1;
      } while (0x3fff < uVar2);
      *pbVar7 = (byte)uVar3;
    }
  }
  output->cur_ = pbVar6;
  puVar5 = io::EpsCopyOutputStream::WriteRawMaybeAliased
                     (&output->impl_,*ptr,*(int *)((long)ptr + 8),pbVar6);
  output->cur_ = puVar5;
  return;
}

Assistant:

static void Serialize(const void* ptr, io::CodedOutputStream* output) {
    const Type& value = *static_cast<const Type*>(ptr);
    output->WriteVarint32(value.size());
    output->WriteRawMaybeAliased(value.data(), value.size());
  }